

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterproperties.cpp
# Opt level: O0

UnicodeSet * icu_63::getInclusionsForSource(UPropertySource src,UErrorCode *errorCode)

{
  UBool UVar1;
  Inclusion *i;
  UErrorCode *errorCode_local;
  UnicodeSet *pUStack_10;
  UPropertySource src_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (((int)src < 0) || (0xe < (int)src)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      pUStack_10 = (UnicodeSet *)0x0;
    }
    else {
      umtx_initOnce<UPropertySource>
                ((UInitOnce *)(&DAT_005464d8 + (ulong)src * 0x10),CharacterProperties::initInclusion
                 ,src,errorCode);
      pUStack_10 = (UnicodeSet *)(&::(anonymous_namespace)::gInclusions)[(ulong)src * 2];
    }
  }
  else {
    pUStack_10 = (UnicodeSet *)0x0;
  }
  return pUStack_10;
}

Assistant:

const UnicodeSet *getInclusionsForSource(UPropertySource src, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return nullptr; }
    if (src < 0 || UPROPS_SRC_COUNT <= src) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return nullptr;
    }
    Inclusion &i = gInclusions[src];
    umtx_initOnce(i.fInitOnce, &CharacterProperties::initInclusion, src, errorCode);
    return i.fSet;
}